

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_repository.cpp
# Opt level: O3

dispatcher_ref_t __thiscall
so_5::impl::disp_repository_t::query_named_dispatcher(disp_repository_t *this,string *disp_name)

{
  ulong *puVar1;
  long *plVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  ulong uVar5;
  iterator iVar6;
  key_type *in_RDX;
  key_type *extraout_RDX;
  key_type *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  dispatcher_ref_t dVar8;
  
  LOCK();
  puVar1 = (ulong *)((long)&disp_name[3].field_2 + 8);
  uVar5 = *puVar1;
  *puVar1 = *puVar1 + 2;
  UNLOCK();
  _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  while ((uVar5 & 1) != 0) {
    sched_yield();
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    uVar5 = *(ulong *)((long)&disp_name[3].field_2 + 8);
  }
  if (*(int *)&disp_name[3].field_2 == 1) {
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
                    *)&disp_name->field_2,in_RDX);
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
    if ((_Base_ptr)((long)&disp_name->field_2 + 8) != iVar6._M_node) {
      p_Var4 = iVar6._M_node[2]._M_parent;
      p_Var3 = iVar6._M_node[2]._M_parent;
      this->_vptr_disp_repository_t = *(_func_int ***)(iVar6._M_node + 2);
      this->m_env = (environment_t *)p_Var4;
      if (p_Var3 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
        }
      }
      goto LAB_00215aa2;
    }
  }
  this->_vptr_disp_repository_t = (_func_int **)0x0;
  this->m_env = (environment_t *)0x0;
LAB_00215aa2:
  LOCK();
  plVar2 = (long *)((long)&disp_name[3].field_2 + 8);
  *plVar2 = *plVar2 + -2;
  UNLOCK();
  dVar8.super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  dVar8.super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (dispatcher_ref_t)dVar8.super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

dispatcher_ref_t
disp_repository_t::query_named_dispatcher(
	const std::string & disp_name )
{
	read_lock_guard_t< default_rw_spinlock_t > lock( m_lock );
	if( state_t::started == m_state )
	{
		named_dispatcher_map_t::iterator it =
			m_named_dispatcher_map.find( disp_name );

		if( m_named_dispatcher_map.end() != it )
		{
			return it->second;
		}
	}

	return dispatcher_ref_t();
}